

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitStringEncode(PrintExpressionContents *this,StringEncode *curr)

{
  long lVar1;
  ostream *stream;
  char *pcVar2;
  
  switch(curr->op) {
  case StringEncodeUTF8:
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.encode_wtf8 utf8";
    break;
  case StringEncodeWTF8:
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.encode_wtf8 wtf8";
    break;
  case StringEncodeWTF16:
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.encode_wtf16";
    lVar1 = 0x13;
    goto LAB_008554a7;
  case StringEncodeUTF8Array:
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.encode_wtf8_array utf8";
    goto LAB_00855442;
  case StringEncodeWTF8Array:
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.encode_wtf8_array wtf8";
LAB_00855442:
    lVar1 = 0x1d;
    goto LAB_008554a7;
  case StringEncodeWTF16Array:
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.encode_wtf16_array";
    lVar1 = 0x19;
    goto LAB_008554a7;
  default:
    handle_unreachable("invalid string.encode*",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                       ,0x99a);
  }
  lVar1 = 0x17;
LAB_008554a7:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
  Colors::outputColorCode(stream,"\x1b[0m");
  return;
}

Assistant:

void visitStringEncode(StringEncode* curr) {
    switch (curr->op) {
      case StringEncodeUTF8:
        printMedium(o, "string.encode_wtf8 utf8");
        break;
      case StringEncodeWTF8:
        printMedium(o, "string.encode_wtf8 wtf8");
        break;
      case StringEncodeWTF16:
        printMedium(o, "string.encode_wtf16");
        break;
      case StringEncodeUTF8Array:
        printMedium(o, "string.encode_wtf8_array utf8");
        break;
      case StringEncodeWTF8Array:
        printMedium(o, "string.encode_wtf8_array wtf8");
        break;
      case StringEncodeWTF16Array:
        printMedium(o, "string.encode_wtf16_array");
        break;
      default:
        WASM_UNREACHABLE("invalid string.encode*");
    }
  }